

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::ArgMinMaxState<duckdb::string_t,long>,duckdb::string_t,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  ArgMinMaxState<duckdb::string_t,_long> *in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  string_t *rdata_1;
  ArgMinMaxState<duckdb::string_t,_long> **sdata_1;
  AggregateFinalizeData finalize_data;
  string_t *rdata;
  ArgMinMaxState<duckdb::string_t,_long> **sdata;
  string_t *in_stack_ffffffffffffff78;
  ArgMinMaxState<duckdb::string_t,_long> *in_stack_ffffffffffffff80;
  ArgMinMaxState<duckdb::string_t,_long> *state;
  AggregateFinalizeData local_78;
  string_t *local_60;
  ArgMinMaxState<duckdb::string_t,_long> **local_58;
  AggregateFinalizeData local_50;
  string_t *local_38;
  ArgMinMaxState<duckdb::string_t,_long> **local_30;
  long local_28;
  ArgMinMaxState<duckdb::string_t,_long> *local_20;
  Vector *local_18;
  AggregateInputData *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_30 = ConstantVector::GetData<duckdb::ArgMinMaxState<duckdb::string_t,long>*>
                         ((Vector *)0x91a830);
    local_38 = ConstantVector::GetData<duckdb::string_t>((Vector *)0x91a83f);
    AggregateFinalizeData::AggregateFinalizeData(&local_50,local_18,local_10);
    ArgMinMaxBase<duckdb::LessThan,false>::
    Finalize<duckdb::string_t,duckdb::ArgMinMaxState<duckdb::string_t,long>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x91a86f
              );
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_58 = FlatVector::GetData<duckdb::ArgMinMaxState<duckdb::string_t,long>*>
                         ((Vector *)0x91a88d);
    local_60 = FlatVector::GetData<duckdb::string_t>((Vector *)0x91a89c);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,local_18,local_10);
    for (state = (ArgMinMaxState<duckdb::string_t,_long> *)0x0; state < local_20;
        state = (ArgMinMaxState<duckdb::string_t,_long> *)
                &(state->super_ArgMinMaxStateBase).arg_null) {
      local_78.result_idx = (idx_t)(&(state->super_ArgMinMaxStateBase).is_initialized + local_28);
      ArgMinMaxBase<duckdb::LessThan,false>::
      Finalize<duckdb::string_t,duckdb::ArgMinMaxState<duckdb::string_t,long>>
                (state,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x91a902);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}